

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O1

void Cut_NodeDoComputeCuts
               (Cut_Man_t *p,Cut_List_t *pSuper,int Node,int fCompl0,int fCompl1,Cut_Cut_t *pList0,
               Cut_Cut_t *pList1,int fTriv,int TreeCode)

{
  Cut_Cut_t **ppCVar1;
  uint uVar2;
  int iVar3;
  Cut_Cut_t *pCVar4;
  ulong uVar5;
  Cut_Cut_t *pCVar6;
  Cut_Cut_t *pCVar7;
  Cut_Cut_t *pCVar8;
  Cut_Cut_t *pCVar9;
  Cut_Cut_t *local_40;
  
  if (fTriv != 0) {
    pCVar4 = Cut_CutCreateTriv(p,Node);
    if (0xbfffffff < *(uint *)pCVar4 + 0xf0000000) {
      __assert_fail("pCut->nLeaves > 0 && pCut->nLeaves <= CUT_SIZE_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutList.h"
                    ,0x59,"void Cut_ListAdd(Cut_List_t *, Cut_Cut_t *)");
    }
    *pSuper->ppTail[*(uint *)pCVar4 >> 0x1c] = pCVar4;
    pSuper->ppTail[*(uint *)pCVar4 >> 0x1c] = &pCVar4->pNext;
    p->nNodeCuts = p->nNodeCuts + 1;
  }
  if ((pList1 != (Cut_Cut_t *)0x0 && pList0 != (Cut_Cut_t *)0x0) &&
     ((TreeCode == 0 || (p->pParams->fLocal == 0)))) {
    uVar2 = p->pParams->nVarsMax;
    p->fSimul = (*(uint *)pList1 >> 0x16 & 1 ^ fCompl1) & (*(uint *)pList0 >> 0x16 & 1 ^ fCompl0);
    p->fCompl0 = fCompl0;
    p->fCompl1 = fCompl1;
    if ((TreeCode & 1U) == 0) {
      pCVar4 = (Cut_Cut_t *)0x0;
    }
    else {
      if (((undefined1  [24])*pList0 & (undefined1  [24])0xf0000000) != (undefined1  [24])0x10000000
         ) {
        __assert_fail("pList0->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                      ,600,
                      "void Cut_NodeDoComputeCuts(Cut_Man_t *, Cut_List_t *, int, int, int, Cut_Cut_t *, Cut_Cut_t *, int, int)"
                     );
      }
      pCVar4 = pList0->pNext;
      pList0->pNext = (Cut_Cut_t *)0x0;
    }
    pCVar7 = pList0;
    if ((TreeCode & 2U) == 0) {
      local_40 = (Cut_Cut_t *)0x0;
    }
    else {
      if (((undefined1  [24])*pList1 & (undefined1  [24])0xf0000000) != (undefined1  [24])0x10000000
         ) {
        __assert_fail("pList1->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                      ,0x25e,
                      "void Cut_NodeDoComputeCuts(Cut_Man_t *, Cut_List_t *, int, int, int, Cut_Cut_t *, Cut_Cut_t *, int, int)"
                     );
      }
      local_40 = pList1->pNext;
      pList1->pNext = (Cut_Cut_t *)0x0;
    }
    do {
      pCVar9 = pList1;
      if (*(uint *)pCVar7 >> 0x1c == uVar2) break;
      pCVar7 = pCVar7->pNext;
    } while (pCVar7 != (Cut_Cut_t *)0x0);
    do {
      if (*(uint *)pCVar9 >> 0x1c == uVar2) break;
      pCVar9 = pCVar9->pNext;
    } while (pCVar9 != (Cut_Cut_t *)0x0);
    pCVar8 = pList0;
    if (pCVar7 != pList0) {
      do {
        pCVar6 = pList1;
        if (pCVar9 != pList1) {
          do {
            iVar3 = Cut_CutProcessTwo(p,pCVar8,pCVar6,pSuper);
            if (iVar3 != 0) goto LAB_004b563f;
            pCVar6 = pCVar6->pNext;
          } while (pCVar6 != pCVar9);
        }
        ppCVar1 = &pCVar8->pNext;
        pCVar8 = *ppCVar1;
      } while (*ppCVar1 != pCVar7);
    }
    pCVar8 = pCVar9;
    pCVar6 = pList0;
    if (pCVar7 != pList0) {
      do {
        for (; pCVar8 != (Cut_Cut_t *)0x0; pCVar8 = pCVar8->pNext) {
          if (((pCVar6->uSign & ~pCVar8->uSign) == 0) &&
             (iVar3 = Cut_CutProcessTwo(p,pCVar6,pCVar8,pSuper), iVar3 != 0)) goto LAB_004b563f;
        }
        ppCVar1 = &pCVar6->pNext;
        pCVar8 = pCVar9;
        pCVar6 = *ppCVar1;
      } while (*ppCVar1 != pCVar7);
    }
    pCVar8 = pCVar7;
    pCVar6 = pList1;
    if (pCVar9 != pList1) {
      do {
        for (; pCVar8 != (Cut_Cut_t *)0x0; pCVar8 = pCVar8->pNext) {
          if (((pCVar6->uSign & ~pCVar8->uSign) == 0) &&
             (iVar3 = Cut_CutProcessTwo(p,pCVar8,pCVar6,pSuper), iVar3 != 0)) goto LAB_004b563f;
        }
        ppCVar1 = &pCVar6->pNext;
        pCVar8 = pCVar7;
        pCVar6 = *ppCVar1;
      } while (*ppCVar1 != pCVar9);
    }
    for (; pCVar8 = pCVar9, pCVar7 != (Cut_Cut_t *)0x0; pCVar7 = pCVar7->pNext) {
      for (; pCVar8 != (Cut_Cut_t *)0x0; pCVar8 = pCVar8->pNext) {
        if ((*(uint *)pCVar7 >> 0x1c != uVar2) || (*(uint *)pCVar8 >> 0x1c != uVar2)) {
          __assert_fail("pTemp0->nLeaves == (unsigned)Limit && pTemp1->nLeaves == (unsigned)Limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                        ,0x287,
                        "void Cut_NodeDoComputeCuts(Cut_Man_t *, Cut_List_t *, int, int, int, Cut_Cut_t *, Cut_Cut_t *, int, int)"
                       );
        }
        if (pCVar7->uSign == pCVar8->uSign) {
          if (0 < (int)uVar2) {
            uVar5 = 0;
            do {
              if (*(int *)(&pCVar7[1].field_0x0 + uVar5 * 4) !=
                  *(int *)(&pCVar8[1].field_0x0 + uVar5 * 4)) goto LAB_004b561e;
              uVar5 = uVar5 + 1;
            } while (uVar2 != uVar5);
          }
          iVar3 = Cut_CutProcessTwo(p,pCVar7,pCVar8,pSuper);
          if (iVar3 != 0) goto LAB_004b563f;
        }
LAB_004b561e:
      }
    }
    if (p->nNodeCuts == 0) {
      p->nNodesNoCuts = p->nNodesNoCuts + 1;
    }
LAB_004b563f:
    if ((TreeCode & 1U) != 0) {
      pList0->pNext = pCVar4;
    }
    if ((TreeCode & 2U) != 0) {
      pList1->pNext = local_40;
    }
  }
  return;
}

Assistant:

void Cut_NodeDoComputeCuts( Cut_Man_t * p, Cut_List_t * pSuper, int Node, int fCompl0, int fCompl1, Cut_Cut_t * pList0, Cut_Cut_t * pList1, int fTriv, int TreeCode )
{
    Cut_Cut_t * pStop0, * pStop1, * pTemp0, * pTemp1;
    Cut_Cut_t * pStore0 = NULL, * pStore1 = NULL; // Suppress "might be used uninitialized"
    int i, nCutsOld, Limit;
    // start with the elementary cut
    if ( fTriv ) 
    {
//        printf( "Creating trivial cut %d.\n", Node );
        pTemp0 = Cut_CutCreateTriv( p, Node );
        Cut_ListAdd( pSuper, pTemp0 );
        p->nNodeCuts++;
    }
    // get the cut lists of children
    if ( pList0 == NULL || pList1 == NULL || (p->pParams->fLocal && TreeCode)  )
        return;

    // remember the old number of cuts
    nCutsOld = p->nCutsCur;
    Limit = p->pParams->nVarsMax;
    // get the simultation bit of the node
    p->fSimul = (fCompl0 ^ pList0->fSimul) & (fCompl1 ^ pList1->fSimul);
    // set temporary variables
    p->fCompl0 = fCompl0;
    p->fCompl1 = fCompl1;
    // if tree cuts are computed, make sure only the unit cuts propagate over the DAG nodes
    if ( TreeCode & 1 )
    {
        assert( pList0->nLeaves == 1 );
        pStore0 = pList0->pNext;
        pList0->pNext = NULL;
    }
    if ( TreeCode & 2 )
    {
        assert( pList1->nLeaves == 1 );
        pStore1 = pList1->pNext;
        pList1->pNext = NULL;
    }
    // find the point in the list where the max-var cuts begin
    Cut_ListForEachCut( pList0, pStop0 )
        if ( pStop0->nLeaves == (unsigned)Limit )
            break;
    Cut_ListForEachCut( pList1, pStop1 )
        if ( pStop1->nLeaves == (unsigned)Limit )
            break;

    // small by small
    Cut_ListForEachCutStop( pList0, pTemp0, pStop0 )
    Cut_ListForEachCutStop( pList1, pTemp1, pStop1 )
    {
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    }
    // small by large
    Cut_ListForEachCutStop( pList0, pTemp0, pStop0 )
    Cut_ListForEachCut( pStop1, pTemp1 )
    {
        if ( (pTemp0->uSign & pTemp1->uSign) != pTemp0->uSign )
            continue;
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    }
    // small by large
    Cut_ListForEachCutStop( pList1, pTemp1, pStop1 )
    Cut_ListForEachCut( pStop0, pTemp0 )
    {
        if ( (pTemp0->uSign & pTemp1->uSign) != pTemp1->uSign )
            continue;
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    }
    // large by large
    Cut_ListForEachCut( pStop0, pTemp0 )
    Cut_ListForEachCut( pStop1, pTemp1 )
    {
        assert( pTemp0->nLeaves == (unsigned)Limit && pTemp1->nLeaves == (unsigned)Limit );
        if ( pTemp0->uSign != pTemp1->uSign )
            continue;
        for ( i = 0; i < Limit; i++ )
            if ( pTemp0->pLeaves[i] != pTemp1->pLeaves[i] )
                break;
        if ( i < Limit )
            continue;
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    } 
    if ( p->nNodeCuts == 0 )
        p->nNodesNoCuts++;
Quits:
    if ( TreeCode & 1 )
        pList0->pNext = pStore0;
    if ( TreeCode & 2 )
        pList1->pNext = pStore1;
}